

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParser.cpp
# Opt level: O3

void iDynTree::XMLParser::XMLParserPimpl::parserCallbackEndTag
               (void *context,xmlChar *localname,xmlChar *prefix,xmlChar *URI)

{
  XMLElement *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar1;
  undefined8 *puVar2;
  long *plVar3;
  long lVar4;
  ulong *puVar5;
  ulong uVar6;
  undefined8 uVar7;
  string message;
  string local_e0;
  ulong *local_c0;
  long local_b8;
  ulong local_b0;
  long lStack_a8;
  long *local_a0;
  undefined8 local_98;
  long local_90;
  undefined8 uStack_88;
  XMLElement *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  string local_70;
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  lVar1 = *context;
  lVar4 = *(long *)(lVar1 + 0x130);
  if (lVar4 == *(long *)(lVar1 + 0x138)) {
    lVar4 = *(long *)(*(long *)(lVar1 + 0x148) + -8) + 0x200;
  }
  this = *(XMLElement **)(lVar4 + -0x10);
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar4 + -8);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      lVar1 = *context;
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  if (*(char *)(lVar1 + 0x1a1) != '\x01') goto LAB_0010a92a;
  local_c0 = &local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Content of tag: ","");
  XMLElement::getParsedTextContent_abi_cxx11_(&local_e0,this);
  uVar6 = 0xf;
  if (local_c0 != &local_b0) {
    uVar6 = local_b0;
  }
  if (uVar6 < local_e0._M_string_length + local_b8) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      uVar7 = local_e0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_e0._M_string_length + local_b8) goto LAB_0010a684;
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,(ulong)local_c0);
  }
  else {
LAB_0010a684:
    puVar2 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_e0._M_dataplus._M_p);
  }
  local_a0 = &local_90;
  plVar3 = puVar2 + 2;
  if ((long *)*puVar2 == plVar3) {
    local_90 = *plVar3;
    uStack_88 = puVar2[3];
  }
  else {
    local_90 = *plVar3;
    local_a0 = (long *)*puVar2;
  }
  local_98 = puVar2[1];
  *puVar2 = plVar3;
  puVar2[1] = 0;
  *(undefined1 *)plVar3 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  iDynTree::reportInfo("XMLParser","parserCallbackEndTag",(char *)local_a0);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"End of tag <","");
  XMLElement::name_abi_cxx11_(&local_70,this);
  uVar6 = 0xf;
  if (local_50 != local_40) {
    uVar6 = local_40[0];
  }
  if (uVar6 < local_70._M_string_length + local_48) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      uVar7 = local_70.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_70._M_string_length + local_48) goto LAB_0010a7bb;
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_50);
  }
  else {
LAB_0010a7bb:
    puVar2 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70._M_dataplus._M_p);
  }
  puVar5 = puVar2 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar5) {
    local_e0.field_2._M_allocated_capacity = *puVar5;
    local_e0.field_2._8_8_ = puVar2[3];
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  }
  else {
    local_e0.field_2._M_allocated_capacity = *puVar5;
    local_e0._M_dataplus._M_p = (pointer)*puVar2;
  }
  local_e0._M_string_length = puVar2[1];
  *puVar2 = puVar5;
  puVar2[1] = 0;
  *(undefined1 *)puVar5 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_e0);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_b0 = *puVar5;
    lStack_a8 = plVar3[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *puVar5;
    local_c0 = (ulong *)*plVar3;
  }
  local_b8 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_c0);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  iDynTree::reportInfo("XMLParser","parserCallbackEndTag",(char *)local_a0);
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
LAB_0010a92a:
  (*this->_vptr_XMLElement[3])(this);
  std::
  deque<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
  ::pop_back((deque<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
              *)(*context + 0x100));
  lVar1 = *context;
  lVar4 = *(long *)(lVar1 + 0x130);
  if (lVar4 != *(long *)(lVar1 + 0x110)) {
    if (lVar4 == *(long *)(lVar1 + 0x138)) {
      lVar4 = *(long *)(*(long *)(lVar1 + 0x148) + -8) + 0x200;
    }
    plVar3 = *(long **)(lVar4 + -0x10);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    local_80 = this;
    local_78 = this_00;
    (**(code **)(*plVar3 + 0x20))(plVar3,&local_80);
    if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
    }
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void XMLParser::XMLParserPimpl::parserCallbackEndTag(void* context,
                                                         const xmlChar * localname,
                                                         const xmlChar * prefix,
                                                         const xmlChar * URI)
    {
        // TODO: use the prefix and uri, or remove them from the parameters        
        XMLParser *state = static_cast<XMLParser*>(context);
        std::shared_ptr<XMLElement> element = state->m_pimpl->m_parsedTrace.top();

        if (state->m_pimpl->m_logParsing) {
            // Add here the optional text content
            std::string message = std::string("Content of tag: ") + element->getParsedTextContent();
            reportInfo("XMLParser", "parserCallbackEndTag", message.c_str());
            
            // TODO: reportXXX should either accept a format + var arguments or something else
            message = std::string("End of tag <") + element->name() + (">");
            reportInfo("XMLParser", "parserCallbackEndTag", message.c_str());
        }
        element->exitElementScope();
        state->m_pimpl->m_parsedTrace.pop();
        // Get a callback also to the parent, if any
        if (!state->m_pimpl->m_parsedTrace.empty()) {
            state->m_pimpl->m_parsedTrace.top()->childHasBeenParsed(element);
        }
    }